

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebFront.hpp
# Opt level: O0

void __thiscall
webfront::
BasicUI<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
::addScript(BasicUI<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
            *this,string_view script)

{
  string_view text;
  TextCommand message;
  WebLink<webfront::networking::TCPNetworkingTS> *pWVar1;
  undefined8 in_RDX;
  out_of_range *anon_var_0;
  undefined8 in_stack_ffffffffffffff78;
  BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
  *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  TxtOpcode opcode;
  TextCommand *in_stack_ffffffffffffff90;
  WebLink<webfront::networking::TCPNetworkingTS> *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb8;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffffc0;
  
  opcode = (TxtOpcode)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  pWVar1 = BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
           ::getLink(in_stack_ffffffffffffff80,(WebLinkId)((ulong)in_stack_ffffffffffffff78 >> 0x30)
                    );
  text._M_str = (char *)in_stack_ffffffffffffffa0;
  text._M_len = (size_t)pWVar1;
  msg::TextCommand::TextCommand(in_stack_ffffffffffffff90,opcode,text);
  message.payloadSpan._M_ptr = (pointer)in_stack_ffffffffffffffb8;
  message._0_8_ = in_RDX;
  message.payloadSpan._M_extent._M_extent_value = in_stack_ffffffffffffffc0._M_extent_value;
  WebLink<webfront::networking::TCPNetworkingTS>::sendCommand<webfront::msg::TextCommand>
            (in_stack_ffffffffffffffa0,message);
  return;
}

Assistant:

void addScript(std::string_view script) const {
        try {
            webFront.getLink(webLinkId).sendCommand(msg::TextCommand(msg::TxtOpcode::injectScript, script));
        }
        catch (const std::out_of_range&) {
            throw ConnectionError("Connection with client lost");
        }
    }